

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::_::
CopyConstructArray_<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry,_kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry_*,_true,_false>
::ExceptionGuard::~ExceptionGuard(ExceptionGuard *this)

{
  Entry *pEVar1;
  
  while (pEVar1 = this->pos, this->start < pEVar1) {
    this->pos = (Entry *)&pEVar1[-3].value;
    ArrayBuilder<capnp::_::RawSchema_*>::dispose
              ((ArrayBuilder<capnp::_::RawSchema_*> *)(pEVar1 + -2));
  }
  return;
}

Assistant:

~ExceptionGuard() noexcept(false) {
      while (pos > start) {
        dtor(*--pos);
      }
    }